

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

Cnf_Dat_t * Cnf_DataDup(Cnf_Dat_t *p)

{
  int *__dest;
  int *__src;
  int iVar1;
  Cnf_Dat_t *pCVar2;
  int local_1c;
  int i;
  Cnf_Dat_t *pCnf;
  Cnf_Dat_t *p_local;
  
  pCVar2 = Cnf_DataAlloc(p->pMan,p->nVars,p->nClauses,p->nLiterals);
  memcpy(*pCVar2->pClauses,*p->pClauses,(long)p->nLiterals << 2);
  __dest = pCVar2->pVarNums;
  __src = p->pVarNums;
  iVar1 = Aig_ManObjNumMax(p->pMan);
  memcpy(__dest,__src,(long)iVar1 << 2);
  for (local_1c = 1; local_1c < p->nClauses; local_1c = local_1c + 1) {
    pCVar2->pClauses[local_1c] =
         *pCVar2->pClauses + ((long)p->pClauses[local_1c] - (long)*p->pClauses >> 2);
  }
  return pCVar2;
}

Assistant:

Cnf_Dat_t * Cnf_DataDup( Cnf_Dat_t * p )
{
    Cnf_Dat_t * pCnf;
    int i;
    pCnf = Cnf_DataAlloc( p->pMan, p->nVars, p->nClauses, p->nLiterals );
    memcpy( pCnf->pClauses[0], p->pClauses[0], sizeof(int) * p->nLiterals );
    memcpy( pCnf->pVarNums, p->pVarNums, sizeof(int) * Aig_ManObjNumMax(p->pMan) );
    for ( i = 1; i < p->nClauses; i++ )
        pCnf->pClauses[i] = pCnf->pClauses[0] + (p->pClauses[i] - p->pClauses[0]);
    return pCnf;
}